

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  uint uVar1;
  ostream *poVar2;
  SectionTracker *pSVar3;
  IStreamingReporter *pIVar4;
  bool bVar5;
  SectionTracker *local_1e8;
  undefined4 local_1dc;
  string local_1d8 [32];
  SectionTracker *local_1b8;
  ITracker *sectionTracker;
  ostringstream local_1a0 [8];
  ostringstream oss;
  Counts *assertions_local;
  SectionInfo *sectionInfo_local;
  RunContext *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,(string *)&sectionInfo->name);
  poVar2 = std::operator<<(poVar2,"@");
  Catch::operator<<(poVar2,&sectionInfo->lineInfo);
  std::__cxx11::ostringstream::str();
  pSVar3 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  local_1b8 = pSVar3;
  uVar1 = (*(pSVar3->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.
            super_IShared.super_NonCopyable._vptr_NonCopyable[7])();
  bVar5 = (uVar1 & 1) != 0;
  if (bVar5) {
    local_1e8 = local_1b8;
    std::
    vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
    ::push_back(&this->m_activeSections,(value_type *)&local_1e8);
    SourceLineInfo::operator=(&(this->m_lastAssertionInfo).lineInfo,&sectionInfo->lineInfo);
    pIVar4 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
    (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar4,sectionInfo);
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = (this->m_totals).assertions.failed;
    assertions->failedButOk = (this->m_totals).assertions.failedButOk;
  }
  local_1dc = 1;
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return bVar5;
}

Assistant:

virtual bool sectionStarted
            (   SectionInfo const& sectionInfo,
                Counts& assertions ) CATCH_OVERRIDE
        {
            std::ostringstream oss;
            oss << sectionInfo.name << "@" << sectionInfo.lineInfo;

            ITracker& sectionTracker = SectionTracker::acquire( m_trackerContext, oss.str() );
            if( !sectionTracker.isOpen() )
                return false;
            m_activeSections.push_back( &sectionTracker );

            m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

            m_reporter->sectionStarting( sectionInfo );

            assertions = m_totals.assertions;

            return true;
        }